

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O3

void __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::resetCovarianceMatrices
          (ModelBaseEKFFlexEstimatorIMU *this)

{
  Matrix *pMVar1;
  long lVar2;
  double dVar3;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *__function;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined1 (*pauVar12) [16];
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  undefined1 auVar19 [16];
  bool bVar21;
  undefined8 uVar22;
  Matrix m;
  SrcEvaluatorType srcEvaluator;
  Matrix6 R;
  DstEvaluatorType dstEvaluator;
  assign_op<double,_double> local_219;
  undefined1 local_218 [16];
  ulong local_208;
  Matrix *local_1f8;
  double *local_1f0;
  long local_1e8;
  ulong local_1e0;
  Matrix *local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  long local_1c0;
  undefined1 local_1b8 [48];
  undefined1 local_188 [8];
  XprType local_180;
  ulong local_168;
  double local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined8 local_e0;
  undefined1 local_d8 [16];
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined1 local_80 [16];
  undefined8 local_70;
  DstEvaluatorType local_68;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,__1,_0,_6,__1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_50;
  double *pdVar8;
  long lVar20;
  
  local_180.m_rhs = (RhsNested)local_180._0_8_;
  iVar7 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])();
  pdVar8 = (double *)CONCAT44(extraout_var,iVar7);
  iVar7 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])(this);
  local_180._0_8_ = CONCAT44(extraout_var_00,iVar7);
  local_188 = (undefined1  [8])pdVar8;
  if (-1 < (long)(local_180._0_8_ | (ulong)pdVar8)) {
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::assign_op<double,double>>
              (&this->R_,
               (CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                *)local_188,(assign_op<double,_double> *)&local_1f0);
    local_188 = (undefined1  [8])0x3eb0c6f7a0b5ed8d;
    local_180.m_lhs = (LhsNested)0x0;
    local_180._3_5_ = 0;
    local_180.m_rhs = (RhsNested)0x0;
    local_158 = 0;
    uStack_150 = 0x3eb0c6f7a0b5ed8d;
    local_148 = 0;
    local_128 = (undefined1  [16])0x0;
    local_118 = 0x3eb0c6f7a0b5ed8d;
    local_e0 = 0x3eb0c6f7a0b5ed8d;
    local_d8 = (undefined1  [16])0x0;
    local_b0 = 0;
    uStack_a8 = 0x3eb0c6f7a0b5ed8d;
    local_a0 = 0;
    local_80 = (undefined1  [16])0x0;
    local_70 = 0x3eb0c6f7a0b5ed8d;
    lVar2 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows;
    if ((lVar2 < 6) ||
       ((this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
        < 6)) {
      __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,
                    "Eigen::Block<Eigen::Matrix<double, -1, -1>, 6, 6>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 6, BlockCols = 6, InnerPanel = false]"
                   );
    }
    pdVar8 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data + 4;
    lVar9 = 0x20;
    do {
      dVar3 = *(double *)(local_188 + lVar9 + -0x18);
      pdVar8[-4] = *(double *)(local_188 + lVar9 + -0x20);
      pdVar8[-3] = dVar3;
      dVar3 = *(double *)(local_188 + lVar9 + -8);
      pdVar8[-2] = *(double *)(local_188 + lVar9 + -0x10);
      pdVar8[-1] = dVar3;
      dVar3 = *(double *)(&local_180.m_lhs.field_0x0 + lVar9);
      *pdVar8 = *(double *)(local_188 + lVar9);
      pdVar8[1] = dVar3;
      lVar9 = lVar9 + 0x30;
      pdVar8 = pdVar8 + lVar2;
    } while (lVar9 != 0x140);
    (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
      _vptr_FlexibilityEstimatorBase[0x44])(this);
    local_218 = (undefined1  [16])0x0;
    local_208 = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)local_218,0x24,6,6);
    local_188 = (undefined1  [8])local_218._8_8_;
    local_180._0_8_ = local_208;
    if (-1 < (long)(local_208 | local_218._8_8_)) {
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_218,
                 (CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  *)local_188,(assign_op<double,_double> *)&local_1f0);
      getDefaultQ();
      pMVar1 = &this->Q_;
      pdVar8 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_data;
      (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)local_188;
      uVar14 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_rows;
      pMVar4 = (Matrix<double,__1,__1,_0,__1,__1> *)
               (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_cols;
      (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           local_180._0_8_;
      (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           (Index)local_180.m_rhs;
      local_188 = (undefined1  [8])pdVar8;
      local_180._0_8_ = uVar14;
      local_180.m_rhs = pMVar4;
      free(pdVar8);
      local_1f8 = pMVar1;
      if (this->withUnmodeledForces_ == true) {
        if (local_218._8_8_ != 6) {
          __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                        ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                        "Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>, Eigen::Matrix<double, 6, 6>>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>, Eigen::Matrix<double, 6, 6>>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
                       );
        }
        if ((long)local_208 < 0) {
          __function = 
          "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 6, -1, 0, 6, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, 6, -1, 0, 6, -1>]"
          ;
          goto LAB_0014fcc3;
        }
        local_168 = local_208;
        local_160 = 0.01;
        local_1c0 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows;
        local_1f0 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data + local_1c0 * 0x18 + 0x18;
        local_1e8 = 6;
        local_1e0 = 6;
        local_1d0 = 0x18;
        local_1c8 = 0x18;
        local_1d8 = pMVar1;
        local_180.m_rhs = (Matrix<double,__1,__1,_0,__1,__1> *)local_218;
        if ((local_1c0 < 0x1e) ||
           ((this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols < 0x1e)) goto LAB_0014fc8f;
        Eigen::internal::
        product_evaluator<Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        ::product_evaluator((product_evaluator<Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                             *)(local_1b8 + 8),&local_180);
        local_1b8._32_8_ = local_160;
        if ((local_1e8 != 6) || (local_1e0 != local_168)) {
          __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                        "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>>]"
                       );
        }
        local_50.m_dst = &local_68;
        local_68.
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_data = local_1f0;
        local_68.
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_outerStride.m_value =
             (local_1d8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
             .m_rows;
        local_50.m_src = (SrcEvaluatorType *)local_1b8;
        local_50.m_functor = &local_219;
        local_50.m_dstExpr = (DstXprType *)&local_1f0;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_-1,_0,_6,_-1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
        ::run(&local_50);
        free((void *)local_1b8._16_8_);
      }
      else {
        lVar2 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows;
        if ((lVar2 < 0x1e) ||
           ((this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols < 0x1e)) goto LAB_0014fc8f;
        pauVar12 = (undefined1 (*) [16])
                   ((this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data + lVar2 * 0x18 + 0x18);
        if (((ulong)pauVar12 & 7) == 0) {
          uVar14 = (ulong)pauVar12 >> 3;
          lVar9 = 6;
          do {
            uVar15 = (uint)uVar14 & 1;
            uVar13 = (ulong)uVar15;
            if ((uVar14 & 1) != 0) {
              *(undefined8 *)*pauVar12 = 0;
            }
            uVar14 = (ulong)(6 - uVar15 & 0xfffffffe | uVar15);
            if (uVar14 <= uVar13 + 2) {
              uVar14 = uVar13 + 2;
            }
            memset(*pauVar12 + uVar13 * 8,0,(~uVar13 + uVar14 & 0xffffffffffffffe) * 8 + 0x10);
            if (uVar13 != 0) {
              *(undefined8 *)(pauVar12[2] + 8) = 0;
            }
            uVar14 = uVar13 + lVar2;
            pauVar12 = (undefined1 (*) [16])(*pauVar12 + lVar2 * 8);
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
        else {
          lVar9 = 6;
          do {
            pauVar12[2] = (undefined1  [16])0x0;
            pauVar12[1] = (undefined1  [16])0x0;
            *pauVar12 = (undefined1  [16])0x0;
            pauVar12 = (undefined1 (*) [16])(*pauVar12 + lVar2 * 8);
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
      }
      lVar2 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows;
      pauVar12 = (undefined1 (*) [16])
                 ((this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data + lVar2 * 0x1e + 0x1e);
      bVar21 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_cols < 0x20 || lVar2 < 0x20;
      if (this->withComBias_ == true) {
        if (bVar21) goto LAB_0014fc8f;
        lVar9 = 0;
        do {
          iVar7 = (int)((ulong)lVar9 >> 0x20);
          uVar15 = -(uint)((int)lVar9 == 0);
          uVar16 = -(uint)(iVar7 == 0);
          uVar17 = -(uint)((int)lVar9 == 1);
          uVar18 = -(uint)(iVar7 == 0);
          *(uint *)*pauVar12 = uVar16 & uVar15 & 0xe826d695;
          *(uint *)(*pauVar12 + 4) = uVar15 & uVar16 & 0x3df12e0b;
          *(uint *)(*pauVar12 + 8) = uVar18 & uVar17 & 0xe826d695;
          *(uint *)(*pauVar12 + 0xc) = uVar17 & uVar18 & 0x3df12e0b;
          lVar9 = lVar9 + 1;
          pauVar12 = (undefined1 (*) [16])(*pauVar12 + lVar2 * 8);
        } while (lVar9 != 2);
      }
      else {
        if (bVar21) goto LAB_0014fc8f;
        if (((ulong)pauVar12 & 7) == 0) {
          uVar14 = (ulong)pauVar12 >> 3;
          lVar9 = 2;
          do {
            uVar15 = (uint)uVar14 & 1;
            uVar13 = (ulong)uVar15;
            if ((uVar14 & 1) != 0) {
              *(undefined8 *)*pauVar12 = 0;
            }
            uVar16 = 2 - uVar15 & 0xfffffffe;
            if (uVar16 != 0) {
              uVar16 = uVar16 | uVar15;
              if ((ulong)uVar16 <= uVar13 + 2) {
                uVar16 = (uint)(uVar13 + 2);
              }
              memset(*pauVar12 + uVar13 * 8,0,(ulong)(uVar16 + ~uVar15 & 2) * 8 + 0x10);
            }
            if (uVar13 != 0) {
              *(undefined8 *)(*pauVar12 + 8) = 0;
            }
            uVar14 = uVar13 + lVar2;
            pauVar12 = (undefined1 (*) [16])(*pauVar12 + lVar2 * 8);
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
        else {
          *pauVar12 = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(*pauVar12 + lVar2 * 8) = (undefined1  [16])0x0;
        }
      }
      auVar6 = _DAT_00183020;
      auVar5 = _DAT_00183010;
      pdVar8 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_data;
      lVar2 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows;
      bVar21 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_cols < 0x23 || lVar2 < 0x23;
      if (this->withAbsolutePos_ == true) {
        if (bVar21) {
LAB_0014fc8f:
          __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                        "Eigen::Block<Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                       );
        }
        pdVar8 = pdVar8 + lVar2 * 0x20 + 0x21;
        lVar9 = 0;
        lVar10 = 0;
        do {
          lVar11 = 0;
          auVar19 = auVar5;
          do {
            bVar21 = SUB164(auVar19 ^ auVar6,4) == -0x80000000 &&
                     SUB164(auVar19 ^ auVar6,0) < -0x7ffffffd;
            if (bVar21) {
              uVar22 = 0x3e45798ee2308c3a;
              if (lVar9 != lVar11) {
                uVar22 = 0;
              }
              *(undefined8 *)((long)pdVar8 + lVar11 + -8) = uVar22;
            }
            if (bVar21) {
              uVar22 = 0x3e45798ee2308c3a;
              if (lVar9 + -8 != lVar11) {
                uVar22 = 0;
              }
              *(undefined8 *)((long)pdVar8 + lVar11) = uVar22;
            }
            lVar20 = auVar19._8_8_;
            auVar19._0_8_ = auVar19._0_8_ + 2;
            auVar19._8_8_ = lVar20 + 2;
            lVar11 = lVar11 + 0x10;
          } while (lVar11 != 0x20);
          lVar10 = lVar10 + 1;
          lVar9 = lVar9 + 8;
          pdVar8 = pdVar8 + lVar2;
        } while (lVar10 != 3);
      }
      else {
        if (bVar21) goto LAB_0014fc8f;
        pauVar12 = (undefined1 (*) [16])(pdVar8 + lVar2 * 0x20 + 0x20);
        if (((ulong)pauVar12 & 7) == 0) {
          uVar14 = (ulong)pauVar12 >> 3;
          lVar9 = 3;
          do {
            uVar15 = (uint)uVar14 & 1;
            uVar13 = (ulong)uVar15;
            if ((uVar14 & 1) != 0) {
              *(undefined8 *)*pauVar12 = 0;
            }
            memset(*pauVar12 + uVar13 * 8,0,(ulong)(uVar15 + 2 + ~uVar15 & 2) * 8 + 0x10);
            if (uVar13 == 0) {
              *(undefined8 *)pauVar12[1] = 0;
            }
            uVar14 = uVar13 + lVar2;
            pauVar12 = (undefined1 (*) [16])(*pauVar12 + lVar2 * 8);
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
        else {
          *pauVar12 = (undefined1  [16])0x0;
          pdVar8[lVar2 * 0x20 + 0x22] = 0.0;
          pdVar8[lVar2 * 0x21 + 0x22] = 0.0;
          *(undefined1 (*) [16])(*pauVar12 + lVar2 * 8) = (undefined1  [16])0x0;
          pdVar8[lVar2 * 0x22 + 0x22] = 0.0;
          pauVar12[lVar2] = (undefined1  [16])0x0;
        }
      }
      KalmanFilterBase::setQ
                (&(this->super_EKFFlexibilityEstimatorBase).ekf_.super_KalmanFilterBase,local_1f8);
      (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
        _vptr_FlexibilityEstimatorBase[0x3e])(this);
      free((void *)local_218._0_8_);
      return;
    }
  }
  __function = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_identity_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
  ;
LAB_0014fcc3:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,__function);
}

Assistant:

void ModelBaseEKFFlexEstimatorIMU::resetCovarianceMatrices()
{

  /////// std::cout << "\n\n\n ============> RESET COVARIANCE MATRIX <=============== \n\n\n" << std::endl;

  R_ = Matrix::Identity(getMeasurementSize(), getMeasurementSize());
  R_.block<6, 6>(0, 0) = getDefaultRIMU();

  updateMeasurementCovarianceMatrix_();
  stateObservation::Matrix m;
  m.resize(6, 6);
  m.setIdentity();

  Q_ = getDefaultQ();

  if(withUnmodeledForces_)
    Q_.block(state::unmodeledForces, state::unmodeledForces, 6, 6) = Matrix6::Identity() * m * 1.e-2;
  else
    Q_.block(state::unmodeledForces, state::unmodeledForces, 6, 6).setZero();

  if(withComBias_)
    Q_.block(state::comBias, state::comBias, 2, 2) = Matrix::Identity(2, 2) * 2.5e-10;
  else
    Q_.block(state::comBias, state::comBias, 2, 2).setZero();

  if(withAbsolutePos_)
    Q_.block(state::drift, state::drift, 3, 3) = Matrix::Identity(3, 3) * 1e-8;
  else
    Q_.block(state::drift, state::drift, 3, 3).setZero();

  ekf_.setQ(Q_);
  resetStateCovarianceMatrix();
}